

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayObjectTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::VertexArrayObjectTest::~VertexArrayObjectTest(VertexArrayObjectTest *this)

{
  pointer puVar1;
  pointer pBVar2;
  pointer pAVar3;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__VertexArrayObjectTest_0217eca8;
  puVar1 = (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_buffers).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  pBVar2 = (this->m_spec).buffers.
           super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pBVar2 != (pointer)0x0) {
    operator_delete(pBVar2,(long)(this->m_spec).buffers.
                                 super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pBVar2);
  }
  pAVar3 = (this->m_spec).vao.attributes.
           super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pAVar3 != (pointer)0x0) {
    operator_delete(pAVar3,(long)(this->m_spec).vao.attributes.
                                 super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pAVar3);
  }
  pAVar3 = (this->m_spec).state.attributes.
           super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pAVar3 != (pointer)0x0) {
    operator_delete(pAVar3,(long)(this->m_spec).state.attributes.
                                 super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pAVar3);
  }
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

VertexArrayObjectTest::~VertexArrayObjectTest (void)
{
}